

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,void **vtt,
          int64_t globalsize)

{
  void *in_RDX;
  TPZFileEqnStorage<float> *in_RSI;
  void **in_RDI;
  int64_t in_stack_ffffffffffffffb8;
  void **GlobalSize;
  TPZAbstractFrontMatrix<float> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  TPZFileEqnStorage<float> *this_00;
  
  this_00 = in_RSI;
  TPZAbstractFrontMatrix<float>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffd0,in_RDI,(int64_t)in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = (((TPZFront<float> *)&in_RSI->super_TPZSavable)->super_TPZSavable)._vptr_TPZSavable;
  TPZFileEqnStorage<float>::TPZFileEqnStorage(this_00);
  GlobalSize = in_RDI + 0x1b;
  TPZFrontNonSym<float>::TPZFrontNonSym((TPZFrontNonSym<float> *)in_RSI);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x42));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x46));
  TPZFrontNonSym<float>::Reset((TPZFrontNonSym<float> *)in_RSI,(int64_t)GlobalSize);
  TPZFileEqnStorage<float>::Reset((TPZFileEqnStorage<float> *)(in_RDI + 4));
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[0x41] = (void *)0xffffffffffffffff;
  in_RDI[0x40] = in_RDX;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix(int64_t globalsize) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>(globalsize,globalsize)
{
	fFront.Reset(globalsize);
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=globalsize;
}